

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtextures.c
# Opt level: O2

_Bool IsTextureValid(Texture2D texture)

{
  undefined4 in_EAX;
  int iVar1;
  undefined1 auVar2 [16];
  
  auVar2._0_4_ = -(uint)(0 < texture.width);
  auVar2._4_4_ = -(uint)(0 < texture.height);
  auVar2._8_4_ = -(uint)(0 < texture.mipmaps);
  auVar2._12_4_ = -(uint)(0 < texture.format);
  iVar1 = movmskps(in_EAX,auVar2);
  return iVar1 == 0xf && texture.id != 0;
}

Assistant:

bool IsTextureValid(Texture2D texture)
{
    bool result = false;

    // TODO: Validate maximum texture size supported by GPU

    if ((texture.id > 0) &&         // Validate OpenGL id (texture uplaoded to GPU)
        (texture.width > 0) &&      // Validate texture width
        (texture.height > 0) &&     // Validate texture height
        (texture.format > 0) &&     // Validate texture pixel format
        (texture.mipmaps > 0)) result = true;     // Validate texture mipmaps (at least 1 for basic mipmap level)

    return result;
}